

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O2

nva_card * nva_init_gpu(pci_device *dev)

{
  int iVar1;
  nva_card *__ptr;
  pci_io_handle *ppVar2;
  size_t sVar3;
  pciaddr_t pVar4;
  uint uVar5;
  
  __ptr = (nva_card *)calloc(0x90,1);
  if (__ptr == (nva_card *)0x0) {
    return (nva_card *)0x0;
  }
  (__ptr->bus).pci = dev;
  iVar1 = pci_device_map_range(dev,dev->regions[0].base_addr,dev->regions[0].size,1,&__ptr->bar0);
  if (iVar1 != 0) {
    fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)dev->domain,(ulong)dev->bus,
            (ulong)dev->dev,(ulong)dev->func);
    free(__ptr);
    return (nva_card *)0x0;
  }
  __ptr->bar0len = dev->regions[0].size;
  sVar3 = dev->regions[1].size;
  if (sVar3 != 0) {
    __ptr->hasbar1 = 1;
    __ptr->bar1len = sVar3;
    iVar1 = pci_device_map_range(dev,dev->regions[1].base_addr,sVar3,1,&__ptr->bar1);
    if (iVar1 != 0) {
      __ptr->bar1 = (void *)0x0;
    }
  }
  sVar3 = dev->regions[2].size;
  if ((sVar3 == 0) || ((dev->regions[2].field_0x20 & 1) != 0)) {
    sVar3 = dev->regions[3].size;
    if (sVar3 != 0) {
      __ptr->hasbar2 = 1;
      __ptr->bar2len = sVar3;
      pVar4 = dev->regions[3].base_addr;
      goto LAB_00102ca2;
    }
  }
  else {
    __ptr->hasbar2 = 1;
    __ptr->bar2len = sVar3;
    pVar4 = dev->regions[2].base_addr;
LAB_00102ca2:
    iVar1 = pci_device_map_range(dev,pVar4,sVar3,1,&__ptr->bar2);
    if (iVar1 != 0) {
      __ptr->bar2 = (void *)0x0;
    }
  }
  pci_device_map_legacy(dev,0,0x100000,1,&__ptr->rawmem);
  ppVar2 = (pci_io_handle *)pci_legacy_open_io(dev,0,0x10000);
  __ptr->rawio = ppVar2;
  if (dev->regions[2].size == 0) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = -(uint)((dev->regions[2].field_0x20 & 1) == 0) | 2;
  }
  if ((dev->regions[5].size == 0) || ((dev->regions[5].field_0x20 & 1) == 0)) {
    if (uVar5 == 0xffffffff) goto LAB_00102d5a;
  }
  else {
    uVar5 = 5;
  }
  ppVar2 = (pci_io_handle *)
           pci_device_open_io(dev,dev->regions[uVar5].base_addr,dev->regions[uVar5].size);
  __ptr->iobar = ppVar2;
  __ptr->iobarlen = dev->regions[uVar5].size;
LAB_00102d5a:
  parse_pmc_id(*__ptr->bar0,&__ptr->chipset);
  return __ptr;
}

Assistant:

struct nva_card *nva_init_gpu(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_GPU;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	if (dev->regions[1].size) {
		card->hasbar1 = 1;
		card->bar1len = dev->regions[1].size;
		ret = pci_device_map_range(dev, dev->regions[1].base_addr, dev->regions[1].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar1);
		if (ret) {
			card->bar1 = 0;
		}
	}
	if (dev->regions[2].size && !dev->regions[2].is_IO) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[2].size;
		ret = pci_device_map_range(dev, dev->regions[2].base_addr, dev->regions[2].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	} else if (dev->regions[3].size) {
		card->hasbar2 = 1;
		card->bar2len = dev->regions[3].size;
		ret = pci_device_map_range(dev, dev->regions[3].base_addr, dev->regions[3].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar2);
		if (ret) {
			card->bar2 = 0;
		}
	}
	/* ignore errors */
	pci_device_map_legacy(dev, 0, 0x100000, PCI_DEV_MAP_FLAG_WRITABLE, &card->rawmem);
	card->rawio = pci_legacy_open_io(dev, 0, 0x10000);
	int iobar = -1;
	if (dev->regions[2].size && dev->regions[2].is_IO)
		iobar = 2;
	if (dev->regions[5].size && dev->regions[5].is_IO)
		iobar = 5;
	if (iobar != -1) {
		card->iobar = pci_device_open_io(dev, dev->regions[iobar].base_addr, dev->regions[iobar].size);
		card->iobarlen = dev->regions[iobar].size;
	}
	uint32_t pmc_id = nva_grd32(card->bar0, 0);
	parse_pmc_id(pmc_id, &card->chipset);
	return card;
}